

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  sqlite3_vtab *psVar1;
  Mem *pMVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  sqlite3_value *pFrom;
  char *pcVar6;
  sqlite3_vtab *psVar7;
  sqlite3_module *psVar8;
  Fts5Auxiliary *pFVar9;
  u8 *puVar10;
  u32 nData;
  i64 iVal;
  ulong uVar11;
  Vdbe *pVm;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  u8 *dummy;
  int nByte;
  Fts5Buffer val;
  int local_64;
  sqlite3_vtab *local_60;
  undefined8 local_58;
  u32 local_4c;
  Fts5Buffer local_48;
  int local_34;
  
  psVar1 = pCursor->pVtab;
  psVar8 = psVar1[1].pModule;
  iVar5 = *(int *)&pCursor[4].pVtab;
  iVar14 = *(int *)&psVar8->xBestIndex;
  if (iVar5 == 3) {
    if (iVar14 != iCol) {
      return 0;
    }
    pMVar2 = pCtx->pOut;
    if ((pMVar2->flags & 0x2400) == 0) {
      (pMVar2->u).i = (i64)pCursor[0xb].pVtab;
      pMVar2->flags = 4;
      return 0;
    }
    vdbeReleaseAndSetInt64(pMVar2,(i64)pCursor[0xb].pVtab);
    return 0;
  }
  if (iVar14 == iCol) {
    pMVar2 = pCtx->pOut;
    if ((pMVar2->flags & 0x2400) == 0) {
      (pMVar2->u).i = (i64)pCursor[3].pVtab;
      pMVar2->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMVar2,(i64)pCursor[3].pVtab);
    }
    return 0;
  }
  if (iVar14 + 1 != iCol) {
    if (*(int *)&psVar8->xFilter == 1) {
      return 0;
    }
    iVar5 = fts5SeekCursor((Fts5Cursor *)pCursor,1);
    if (iVar5 == 0) {
      pFrom = sqlite3_column_value((sqlite3_stmt *)pCursor[7].pVtab,iCol + 1);
      sqlite3VdbeMemCopy(pCtx->pOut,pFrom);
      return 0;
    }
    return iVar5;
  }
  if ((iVar5 != 1) && (iVar5 != 4)) {
    if (iVar5 != 2) {
      return 0;
    }
    if (pCursor[8].pVtab == (sqlite3_vtab *)0x0) {
      local_60 = (sqlite3_vtab *)0x0;
    }
    else {
      local_60 = (sqlite3_vtab *)(ulong)*(uint *)((long)&pCursor[8].pVtab[1].pModule + 4);
    }
    local_48.p = (u8 *)0x0;
    local_48.n = 0;
    local_48.nSpace = 0;
    iVar5 = *(int *)((long)&psVar8->xColumn + 4);
    if (iVar5 == 0) {
      if (1 < (int)local_60) {
        uVar12 = (int)local_60 - 1;
        uVar11 = 0;
        do {
          plVar3 = *(long **)(*(long *)&pCursor[8].pVtab[1].nRef + uVar11 * 8);
          lVar15 = *plVar3;
          if ((*(int *)(lVar15 + 4) == 0) &&
             (*(long *)(lVar15 + 0x18) == *(long *)((pCursor[8].pVtab)->zErrMsg + 0x18))) {
            iVal = (i64)(int)plVar3[2];
          }
          else {
            iVal = 0;
          }
          sqlite3Fts5BufferAppendVarint(&local_64,&local_48,iVal);
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      if (0 < (int)local_60) {
        uVar13 = (ulong)local_60 & 0xffffffff;
        uVar11 = 0;
        do {
          plVar3 = *(long **)(*(long *)&pCursor[8].pVtab[1].nRef + uVar11 * 8);
          if ((*(int *)(*plVar3 + 4) == 0) &&
             (*(long *)(*plVar3 + 0x18) == *(long *)((pCursor[8].pVtab)->zErrMsg + 0x18))) {
            puVar10 = (u8 *)plVar3[1];
            nData = *(u32 *)(plVar3 + 2);
          }
          else {
            puVar10 = (u8 *)0x0;
            nData = 0;
          }
          sqlite3Fts5BufferAppendBlob(&local_64,&local_48,nData,puVar10);
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
    }
    else if (iVar5 == 2) {
      bVar16 = true;
      if (1 < (int)local_60) {
        iVar14 = (int)local_60 + -1;
        iVar5 = 1;
        do {
          local_64 = sqlite3Fts5ExprPhraseCollist
                               ((Fts5Expr *)pCursor[8].pVtab,iVar5 + -1,(u8 **)&local_58,
                                (int *)&local_4c);
          sqlite3Fts5BufferAppendVarint(&local_64,&local_48,(long)(int)local_4c);
          bVar16 = local_64 == 0;
          if (!bVar16) break;
          bVar4 = iVar5 < iVar14;
          iVar5 = iVar5 + 1;
        } while (bVar4);
      }
      if ((bVar16) && (0 < (int)local_60)) {
        iVar5 = 1;
        do {
          local_64 = sqlite3Fts5ExprPhraseCollist
                               ((Fts5Expr *)pCursor[8].pVtab,iVar5 + -1,(u8 **)&local_58,
                                (int *)&local_4c);
          sqlite3Fts5BufferAppendBlob
                    (&local_64,&local_48,local_4c,(u8 *)CONCAT44(local_58._4_4_,(int)local_58));
          if (local_64 != 0) break;
          bVar16 = iVar5 < (int)local_60;
          iVar5 = iVar5 + 1;
        } while (bVar16);
      }
    }
    setResultStrOrError(pCtx,(char *)local_48.p,local_48.n,'\0',sqlite3_free);
    return 0;
  }
  pFVar9 = (Fts5Auxiliary *)pCursor[0xe].pVtab;
  if (pFVar9 == (Fts5Auxiliary *)0x0) {
    local_58._0_4_ = 0;
    psVar7 = pCursor[0xc].pVtab;
    if (pCursor[0xd].pVtab != (sqlite3_vtab *)0x0) {
      local_60 = psVar7;
      pcVar6 = sqlite3Fts5Mprintf((int *)&local_58,"SELECT %s");
      psVar7 = local_60;
      iVar5 = (int)local_58;
      if (pcVar6 != (char *)0x0) {
        local_48.p = (u8 *)0x0;
        iVar5 = sqlite3LockAndPrepare
                          (*(sqlite3 **)psVar8,pcVar6,-1,0x81,(Vdbe *)0x0,(sqlite3_stmt **)&local_48
                           ,(char **)0x0);
        local_58._0_4_ = iVar5;
        sqlite3_free(pcVar6);
        puVar10 = local_48.p;
        psVar7 = local_60;
        if (iVar5 == 0) {
          iVar5 = sqlite3_step((sqlite3_stmt *)local_48.p);
          if (iVar5 == 100) {
            if ((sqlite3_vtab *)puVar10 == (sqlite3_vtab *)0x0) {
              uVar12 = 0;
            }
            else {
              uVar12 = (uint)*(ushort *)&((sqlite3_vtab *)((long)puVar10 + 0xc0))->pModule;
            }
            *(uint *)&pCursor[0xf].pVtab = uVar12;
            psVar7 = (sqlite3_vtab *)sqlite3Fts5MallocZero((int *)&local_58,(ulong)(uVar12 << 3));
            pCursor[0x10].pVtab = psVar7;
            local_34 = (int)local_58;
            if (((int)local_58 == 0) && (0 < *(int *)&pCursor[0xf].pVtab)) {
              lVar15 = 0;
              do {
                psVar8 = (sqlite3_module *)sqlite3_column_value((sqlite3_stmt *)puVar10,(int)lVar15)
                ;
                (&(pCursor[0x10].pVtab)->pModule)[lVar15] = psVar8;
                lVar15 = lVar15 + 1;
              } while (lVar15 < *(int *)&pCursor[0xf].pVtab);
            }
            pCursor[0x11].pVtab = (sqlite3_vtab *)puVar10;
            psVar7 = local_60;
            iVar5 = local_34;
          }
          else {
            iVar5 = sqlite3_finalize((sqlite3_stmt *)puVar10);
          }
        }
      }
      if (iVar5 != 0) goto LAB_001b2509;
    }
    pFVar9 = fts5FindAuxiliary((Fts5FullTable *)psVar1[2].pModule,(char *)psVar7);
    if (pFVar9 == (Fts5Auxiliary *)0x0) {
      pcVar6 = sqlite3_mprintf("no such function: %s",psVar7);
      psVar1->zErrMsg = pcVar6;
      iVar5 = 1;
LAB_001b2509:
      pCursor[0xe].pVtab = (sqlite3_vtab *)0x0;
      return iVar5;
    }
    pCursor[0xe].pVtab = (sqlite3_vtab *)pFVar9;
  }
  pCursor[0x12].pVtab = (sqlite3_vtab *)pFVar9;
  (*pFVar9->xFunc)(&sFts5Api,(Fts5Context *)pCursor,pCtx,*(int *)&pCursor[0xf].pVtab,
                   (sqlite3_value **)pCursor[0x10].pVtab);
  pCursor[0x12].pVtab = (sqlite3_vtab *)0x0;
  return 0;
}

Assistant:

static int fts5ColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc = SQLITE_OK;
  
  assert( CsrFlagTest(pCsr, FTS5CSR_EOF)==0 );

  if( pCsr->ePlan==FTS5_PLAN_SPECIAL ){
    if( iCol==pConfig->nCol ){
      sqlite3_result_int64(pCtx, pCsr->iSpecial);
    }
  }else

  if( iCol==pConfig->nCol ){
    /* User is requesting the value of the special column with the same name
    ** as the table. Return the cursor integer id number. This value is only
    ** useful in that it may be passed as the first argument to an FTS5
    ** auxiliary function.  */
    sqlite3_result_int64(pCtx, pCsr->iCsrId);
  }else if( iCol==pConfig->nCol+1 ){

    /* The value of the "rank" column. */
    if( pCsr->ePlan==FTS5_PLAN_SOURCE ){
      fts5PoslistBlob(pCtx, pCsr);
    }else if( 
        pCsr->ePlan==FTS5_PLAN_MATCH
     || pCsr->ePlan==FTS5_PLAN_SORTED_MATCH
    ){
      if( pCsr->pRank || SQLITE_OK==(rc = fts5FindRankFunction(pCsr)) ){
        fts5ApiInvoke(pCsr->pRank, pCsr, pCtx, pCsr->nRankArg, pCsr->apRankArg);
      }
    }
  }else if( !fts5IsContentless(pTab) ){
    rc = fts5SeekCursor(pCsr, 1);
    if( rc==SQLITE_OK ){
      sqlite3_result_value(pCtx, sqlite3_column_value(pCsr->pStmt, iCol+1));
    }
  }
  return rc;
}